

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::SchemaElement::~SchemaElement(SchemaElement *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__SchemaElement_004a6b80;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

SchemaElement::~SchemaElement() noexcept {
}